

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

int Dam_ManUpdateNode(Dam_Man_t *p,int iObj,int iLit0,int iLit1,int iLitNew,Vec_Int_t *vDivs)

{
  uint uVar1;
  float *pfVar2;
  Vec_Que_t *p_00;
  int iVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  undefined7 uVar10;
  uint *puVar9;
  uint iData1;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Vec_Int_t *p_01;
  uint uVar14;
  uint iData0;
  uint local_58;
  uint local_4c;
  
  puVar5 = (uint *)Dam_ObjSet(p,iObj);
  uVar8 = (ulong)*puVar5;
  if ((int)*puVar5 < 1) {
    uVar8 = 0;
  }
  uVar12 = 0;
  do {
    if (uVar8 == uVar12) {
      return 0;
    }
    lVar13 = uVar12 + 1;
    uVar12 = uVar12 + 1;
  } while (puVar5[lVar13] != iLit0);
  uVar12 = 0;
  do {
    if (uVar8 == uVar12) {
      return 0;
    }
    lVar13 = uVar12 + 1;
    uVar12 = uVar12 + 1;
  } while (puVar5[lVar13] != iLit1);
  Vec_IntPush(vDivs,-iObj);
  local_4c = 1;
  lVar13 = 1;
  do {
    lVar6 = (long)(int)local_4c;
    if ((int)*puVar5 < lVar13) {
      puVar5[lVar6] = iLitNew;
      *puVar5 = local_4c;
      return 1;
    }
    uVar1 = puVar5[lVar13];
    if (uVar1 != iLit1 && uVar1 != iLit0) {
      local_4c = local_4c + 1;
      puVar5[lVar6] = uVar1;
      local_58 = 0;
      puVar9 = puVar5;
      for (uVar14 = 0; uVar10 = (undefined7)((ulong)puVar9 >> 8), uVar14 != 2; uVar14 = uVar14 + 1)
      {
        uVar11 = iLit1;
        if (uVar14 == 0) {
          uVar11 = iLit0;
        }
        puVar9 = (uint *)CONCAT71(uVar10,(int)uVar11 < (int)uVar1);
        iData1 = uVar11;
        iData0 = uVar1;
        if (iLit1 < iLit0 != (int)uVar11 < (int)uVar1) {
          iData1 = uVar1;
          iData0 = uVar11;
        }
        piVar7 = Hash_Int2ManLookup(p->vHash,iData0,iData1);
        iVar4 = *piVar7;
        lVar6 = (long)iVar4;
        if (0 < lVar6) {
          if (p->vCounts->nSize <= iVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
          }
          pfVar2 = p->vCounts->pArray;
          pfVar2[lVar6] = pfVar2[lVar6] + -1.0;
          p_00 = p->vQue;
          if ((iVar4 < p_00->nCap) && (-1 < p_00->pOrder[lVar6])) {
            iVar3 = Vec_QueMoveUp(p_00,iVar4);
            if (iVar3 == 0) {
              Vec_QueMoveDown(p_00,iVar4);
            }
            local_58 = local_58 | 1 << (uVar14 & 0x1f);
          }
        }
      }
      if (local_58 == 3) {
        uVar14 = uVar1;
        uVar11 = iLitNew;
        if (iLit1 < iLit0 != iLitNew < (int)uVar1) {
          uVar14 = iLitNew;
          uVar11 = uVar1;
        }
        iVar4 = Hash_Int2ManInsert(p->vHash,uVar14,uVar11,(int)CONCAT71(uVar10,iLitNew < (int)uVar1)
                                  );
        Hash_Int2ObjInc(p->vHash,iVar4);
        Vec_IntPush(vDivs,iVar4);
        p_01 = p->vDivLevR;
        if (p_01->nSize <= iVar4) {
          Vec_IntFillExtra(p_01,(p_01->nSize * 3) / 2,0);
          p_01 = p->vDivLevR;
        }
        iVar3 = Vec_IntEntry(p->vNodLevR,iObj);
        Vec_IntUpdateEntry(p_01,iVar4,iVar3);
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

int Dam_ManUpdateNode( Dam_Man_t * p, int iObj, int iLit0, int iLit1, int iLitNew, Vec_Int_t * vDivs )
{
    int * pSet = Dam_ObjSet( p, iObj );
    int i, k, c, Num, iLit, iLit2, fPres;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit0 )
            break;
    if ( i > pSet[0] )
        return 0;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit1 )
            break;
    if ( i > pSet[0] )
        return 0;
    // compact literals
    Vec_IntPush( vDivs, -iObj );
    for ( k = i = 1; i <= pSet[0]; i++ )
    {
        if ( iLit0 == pSet[i] || iLit1 == pSet[i] )
            continue;
        pSet[k++] = iLit = pSet[i];
        // reduce weights of the divisors
        fPres = 0;
        for ( c = 0; c < 2; c++ )
        {
            iLit2 = c ? iLit1 : iLit0;
            if ( (iLit > iLit2) ^ (iLit0 > iLit1) )
                Num = *Hash_Int2ManLookup( p->vHash, iLit2, iLit );
            else
                Num = *Hash_Int2ManLookup( p->vHash, iLit, iLit2 );
            if ( Num > 0 )
            {
                Vec_FltAddToEntry( p->vCounts, Num, -1 );
                if ( Vec_QueIsMember(p->vQue, Num) )
                {
                    Vec_QueUpdate( p->vQue, Num );
                    fPres |= (1 << c);
                }
            }
        }
        if ( fPres != 3 )
            continue;
        if ( (iLit > iLitNew) ^ (iLit0 > iLit1) )
            Num = Hash_Int2ManInsert( p->vHash, iLitNew, iLit, 0 );
        else
            Num = Hash_Int2ManInsert( p->vHash, iLit, iLitNew, 0 );
        Hash_Int2ObjInc( p->vHash, Num );
        Vec_IntPush( vDivs, Num );
        // update reverse level
        if ( Num >= Vec_IntSize(p->vDivLevR) )
            Vec_IntFillExtra( p->vDivLevR, 3 * Vec_IntSize(p->vDivLevR) / 2, 0 );
        Vec_IntUpdateEntry( p->vDivLevR, Num, Vec_IntEntry(p->vNodLevR, iObj) );
    }
    pSet[k] = iLitNew;
    pSet[0] = k;
    return 1;
}